

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O3

bool absl::debugging_internal::DemangleRustSymbolEncoding(char *mangled,char *out,size_t out_size)

{
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  ReturnAddress RVar13;
  char cVar14;
  int iVar15;
  int ignored_de_bruijn_index;
  int local_1e4;
  RustSymbolParser local_1e0;
  
  memset(&local_1e0,0,400);
  local_1e0.encoding_ = mangled;
  local_1e0.out_ = out;
  local_1e0.out_end_ = out + out_size;
  if (out_size != 0) {
    *out = '\0';
  }
  if (*mangled == '_') {
    iVar15 = 0;
    bVar7 = 0;
    if (mangled[1] == 'R') {
      local_1e0.recursion_depth_ = 1;
      local_1e0.recursion_stack_[0] = kInstantiatingCrate;
      local_1e0.pos_ = 2;
LAB_002f9930:
      lVar10 = (long)local_1e0.pos_ + 1;
      uVar8 = (uint)lVar10;
      bVar1 = local_1e0.encoding_[local_1e0.pos_];
      bVar7 = 0;
      if (bVar1 < 0x4d) {
        if (bVar1 == 0x42) {
          local_1e0.pos_ = uVar8;
          bVar6 = anon_unknown_0::RustSymbolParser::BeginBackref(&local_1e0);
          if (!bVar6) goto LAB_002fac8c;
          if (local_1e0.silence_depth_ != 0) goto switchD_002f9f77_caseD_1c;
          lVar10 = (long)local_1e0.recursion_depth_;
          if (lVar10 == 0x100) goto LAB_002fac8c;
          local_1e0.recursion_depth_ = local_1e0.recursion_depth_ + 1;
          local_1e0.recursion_stack_[lVar10] = kPathBackrefEnding;
        }
        else {
          if (bVar1 == 0x43) {
            bVar7 = 0;
            local_1e0.pos_ = uVar8;
            bVar6 = anon_unknown_0::RustSymbolParser::ParseIdentifier(&local_1e0,'\0');
            if (bVar6) goto LAB_002f9f37;
            goto LAB_002fac8f;
          }
          if (bVar1 != 0x49) goto LAB_002fac8f;
          lVar10 = (long)local_1e0.recursion_depth_;
          if (lVar10 == 0x100) goto LAB_002fac8c;
          local_1e0.recursion_depth_ = local_1e0.recursion_depth_ + 1;
          local_1e0.pos_ = uVar8;
          local_1e0.recursion_stack_[lVar10] = kBeginGenericArgList;
        }
      }
      else {
        if (bVar1 < 0x58) {
          if (bVar1 != 0x4d) {
            if (bVar1 != 0x4e) goto LAB_002fac8f;
            local_1e0.pos_ = local_1e0.pos_ + 2;
            if ((byte)(local_1e0.encoding_[lVar10] + 0xbfU) < 0x1a) {
              lVar9 = (long)local_1e0.namespace_depth_;
              if (lVar9 != 0x40) {
                local_1e0.namespace_depth_ = local_1e0.namespace_depth_ + 1;
                local_1e0.namespace_stack_[lVar9] = local_1e0.encoding_[lVar10];
                lVar10 = (long)local_1e0.recursion_depth_;
                if (lVar10 != 0x100) {
                  local_1e0.recursion_depth_ = local_1e0.recursion_depth_ + 1;
                  local_1e0.recursion_stack_[lVar10] = kIdentifierInUppercaseNamespace;
                  goto switchD_002f9ab7_caseD_43;
                }
              }
              goto LAB_002fac8c;
            }
            if ((0x19 < (byte)(local_1e0.encoding_[lVar10] + 0x9fU)) ||
               (lVar10 = (long)local_1e0.recursion_depth_, lVar10 == 0x100)) goto LAB_002fac8c;
            local_1e0.recursion_depth_ = local_1e0.recursion_depth_ + 1;
            local_1e0.recursion_stack_[lVar10] = kIdentifierInLowercaseNamespace;
            goto switchD_002f9ab7_caseD_43;
          }
          if (local_1e0.silence_depth_ < 1) {
            if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 2) goto LAB_002fac8c;
            local_1e0.out_[0] = '<';
            local_1e0.out_[1] = '\0';
            local_1e0.out_ = local_1e0.out_ + 1;
          }
          RVar13 = kInherentImplType;
        }
        else {
          if (bVar1 != 0x58) {
            if (bVar1 != 0x59) goto LAB_002fac8f;
            if (local_1e0.silence_depth_ < 1) {
              if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 2) goto LAB_002fac8c;
              local_1e0.out_[0] = '<';
              local_1e0.out_[1] = '\0';
              local_1e0.out_ = local_1e0.out_ + 1;
            }
            lVar10 = (long)local_1e0.recursion_depth_;
            if (lVar10 != 0x100) {
              local_1e0.recursion_depth_ = local_1e0.recursion_depth_ + 1;
              local_1e0.pos_ = uVar8;
              local_1e0.recursion_stack_[lVar10] = kTraitDefinitionInfix;
              uVar8 = local_1e0.pos_;
LAB_002f9a76:
              local_1e0.pos_ = uVar8;
              lVar10 = (long)local_1e0.pos_;
              if ((byte)(local_1e0.encoding_[lVar10] + 0x9fU) < 0x1a) {
                local_1e0.pos_ = local_1e0.pos_ + 1;
                bVar7 = local_1e0.encoding_[lVar10] + 0x9f;
                if ((bVar7 < 0x1a) && ((0x3bcfbbfU >> (bVar7 & 0x1f) & 1) != 0)) {
                  if (0 < local_1e0.silence_depth_) goto LAB_002f9f37;
                  pcVar2 = (&PTR_anon_var_dwarf_84b00f_00623c60)[bVar7];
                  sVar11 = strlen(pcVar2);
                  pcVar5 = local_1e0.out_;
                  if (sVar11 + 1 <= (ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_)) {
                    memcpy(local_1e0.out_,pcVar2,sVar11 + 1);
                    local_1e0.out_ = pcVar5 + sVar11;
                    goto LAB_002f9f37;
                  }
                }
                goto LAB_002fac8c;
              }
              switch(local_1e0.encoding_[lVar10]) {
              case 'A':
                local_1e0.pos_ = local_1e0.pos_ + 1;
                if (local_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 2)
                  goto LAB_002fac8c;
                  local_1e0.out_[0] = '[';
                  local_1e0.out_[1] = '\0';
                  local_1e0.out_ = local_1e0.out_ + 1;
                }
                RVar13 = kArraySize;
                break;
              case 'B':
                local_1e0.pos_ = local_1e0.pos_ + 1;
                bVar6 = anon_unknown_0::RustSymbolParser::BeginBackref(&local_1e0);
                if (!bVar6) goto LAB_002fac8c;
                if (local_1e0.silence_depth_ != 0) {
switchD_002f9f77_caseD_1c:
                  lVar10 = (long)local_1e0.position_depth_;
                  local_1e0.position_depth_ = local_1e0.position_depth_ + -1;
                  local_1e0.pos_ = local_1e0.position_stack_[lVar10 + -1];
LAB_002f9f37:
                  bVar7 = 0;
                  if ((iVar15 < 0x1ffff) &&
                     (uVar8 = local_1e0.recursion_depth_, bVar7 = 0, 0 < local_1e0.recursion_depth_)
                     ) {
                    do {
                      pcVar2 = local_1e0.out_;
                      iVar4 = local_1e0.silence_depth_;
                      iVar15 = iVar15 + 1;
                      local_1e0.recursion_depth_ = uVar8 - 1;
                      switch(local_1e0.recursion_stack_[(uint)local_1e0.recursion_depth_]) {
                      case kInstantiatingCrate:
                        if (0x19 < (byte)((local_1e0.encoding_[local_1e0.pos_] & 0xdfU) + 0xbf))
                        goto LAB_002fac6c;
                        local_1e0.silence_depth_ = local_1e0.silence_depth_ + 1;
                        if (local_1e0.recursion_depth_ == 0x100) goto LAB_002fac8c;
                        uVar12 = (ulong)(uint)local_1e0.recursion_depth_;
                        local_1e0.recursion_depth_ = uVar8;
                        local_1e0.recursion_stack_[uVar12] = kVendorSpecificSuffix;
                        goto switchD_002f9ab7_caseD_43;
                      case kVendorSpecificSuffix:
LAB_002fac6c:
                        if (0x2e < (byte)local_1e0.encoding_[local_1e0.pos_]) goto LAB_002fac8c;
                        bVar7 = (byte)(0x401000000001 >>
                                      (local_1e0.encoding_[local_1e0.pos_] & 0x3fU));
                        goto LAB_002fac8f;
                      case kIdentifierInUppercaseNamespace:
                        if (local_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 3)
                          goto LAB_002fac8c;
                          local_1e0.out_[2] = '\0';
                          local_1e0.out_[0] = ':';
                          local_1e0.out_[1] = ':';
                          local_1e0.out_ = local_1e0.out_ + 2;
                        }
                        lVar10 = (long)local_1e0.namespace_depth_;
                        local_1e0.namespace_depth_ = local_1e0.namespace_depth_ + -1;
                        bVar6 = anon_unknown_0::RustSymbolParser::ParseIdentifier
                                          (&local_1e0,local_1e0.namespace_stack_[lVar10 + -1]);
                        goto LAB_002fa488;
                      case kIdentifierInLowercaseNamespace:
                        if (local_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 3)
                          goto LAB_002fac8c;
                          local_1e0.out_[2] = '\0';
                          local_1e0.out_[0] = ':';
                          local_1e0.out_[1] = ':';
                          local_1e0.out_ = local_1e0.out_ + 2;
                        }
                        bVar6 = anon_unknown_0::RustSymbolParser::ParseIdentifier(&local_1e0,'\0');
LAB_002fa488:
                        bVar7 = 0;
                        if ((bVar6 != false) && (iVar15 != 0x1ffff)) goto LAB_002fa6b4;
                        goto LAB_002fac8f;
                      case kInherentImplType:
                        if (local_1e0.recursion_depth_ == 0x100) goto LAB_002fac8c;
                        uVar12 = (ulong)(uint)local_1e0.recursion_depth_;
                        local_1e0.recursion_depth_ = uVar8;
                        local_1e0.recursion_stack_[uVar12] = kInherentImplEnding;
                        uVar8 = local_1e0.pos_;
                        goto LAB_002f9a76;
                      case kInherentImplEnding:
                      case kTraitImplEnding:
                      case kTraitDefinitionEnding:
                        if (0 < local_1e0.silence_depth_) break;
                        if (1 < (ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_)) {
                          local_1e0.out_[0] = '>';
                          local_1e0.out_[1] = '\0';
                          goto LAB_002fa6a0;
                        }
                        goto LAB_002fac8c;
                      case kTraitImplType:
                        if (local_1e0.recursion_depth_ == 0x100) goto LAB_002fac8c;
                        uVar12 = (ulong)(uint)local_1e0.recursion_depth_;
                        local_1e0.recursion_depth_ = uVar8;
                        local_1e0.recursion_stack_[uVar12] = kTraitImplInfix;
                        uVar8 = local_1e0.pos_;
                        goto LAB_002f9a76;
                      case kTraitImplInfix:
                        if (local_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 5)
                          goto LAB_002fac8c;
                          builtin_strncpy(local_1e0.out_," as ",5);
                          local_1e0.out_ = local_1e0.out_ + 4;
                        }
                        if (local_1e0.recursion_depth_ == 0x100) goto LAB_002fac8c;
                        uVar12 = (ulong)(uint)local_1e0.recursion_depth_;
                        local_1e0.recursion_depth_ = uVar8;
                        local_1e0.recursion_stack_[uVar12] = kTraitImplEnding;
                        goto switchD_002f9ab7_caseD_43;
                      case kImplPathEnding:
                      case kFinishFn:
                        goto switchD_002f9f77_caseD_9;
                      case kTraitDefinitionInfix:
                        if (local_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 5)
                          goto LAB_002fac8c;
                          builtin_strncpy(local_1e0.out_," as ",5);
                          local_1e0.out_ = local_1e0.out_ + 4;
                        }
                        if (local_1e0.recursion_depth_ == 0x100) goto LAB_002fac8c;
                        uVar12 = (ulong)(uint)local_1e0.recursion_depth_;
                        local_1e0.recursion_depth_ = uVar8;
                        local_1e0.recursion_stack_[uVar12] = kTraitDefinitionEnding;
                        goto switchD_002f9ab7_caseD_43;
                      case kArraySize:
                        if (local_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 3)
                          goto LAB_002fac8c;
                          local_1e0.out_[2] = '\0';
                          local_1e0.out_[0] = ';';
                          local_1e0.out_[1] = ' ';
                          local_1e0.out_ = local_1e0.out_ + 2;
                        }
                        if (local_1e0.recursion_depth_ != 0x100) {
                          uVar12 = (ulong)(uint)local_1e0.recursion_depth_;
                          local_1e0.recursion_depth_ = uVar8;
                          local_1e0.recursion_stack_[uVar12] = kFinishArray;
                          goto LAB_002fa5d9;
                        }
                        goto LAB_002fac8c;
                      case kFinishArray:
                      case kSliceEnding:
                        if (local_1e0.silence_depth_ < 1) {
                          if (1 < (ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_)) {
                            local_1e0.out_[0] = ']';
                            local_1e0.out_[1] = '\0';
                            goto LAB_002fa6a0;
                          }
                          goto LAB_002fac8c;
                        }
                        break;
                      case kAfterFirstTupleElement:
                        if (local_1e0.encoding_[local_1e0.pos_] != 'E') {
                          if (local_1e0.silence_depth_ < 1) {
                            if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 3)
                            goto LAB_002fac8c;
                            local_1e0.out_[2] = '\0';
                            local_1e0.out_[0] = ',';
                            local_1e0.out_[1] = ' ';
                            local_1e0.out_ = local_1e0.out_ + 2;
                          }
                          if (local_1e0.recursion_depth_ == 0x100) goto LAB_002fac8c;
                          uVar12 = (ulong)(uint)local_1e0.recursion_depth_;
                          local_1e0.recursion_depth_ = uVar8;
                          local_1e0.recursion_stack_[uVar12] = kAfterSecondTupleElement;
                          uVar8 = local_1e0.pos_;
                          goto LAB_002f9a76;
                        }
                        local_1e0.pos_ = local_1e0.pos_ + 1;
                        if (local_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 3)
                          goto LAB_002fac8c;
                          local_1e0.out_[2] = '\0';
                          local_1e0.out_[0] = ',';
                          local_1e0.out_[1] = ')';
                          local_1e0.out_ = local_1e0.out_ + 2;
                        }
                        break;
                      case kAfterSecondTupleElement:
                        if (local_1e0.encoding_[local_1e0.pos_] == 'E') {
                          local_1e0.pos_ = local_1e0.pos_ + 1;
                          goto LAB_002fa325;
                        }
                        if (local_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 3)
                          goto LAB_002fac8c;
                          local_1e0.out_[2] = '\0';
                          local_1e0.out_[0] = ',';
                          local_1e0.out_[1] = ' ';
                          local_1e0.out_ = local_1e0.out_ + 2;
                        }
                        if (local_1e0.recursion_depth_ == 0x100) goto LAB_002fac8c;
                        uVar12 = (ulong)(uint)local_1e0.recursion_depth_;
                        local_1e0.recursion_depth_ = uVar8;
                        local_1e0.recursion_stack_[uVar12] = kAfterThirdTupleElement;
                        uVar8 = local_1e0.pos_;
                        goto LAB_002f9a76;
                      case kAfterThirdTupleElement:
                        if (local_1e0.encoding_[local_1e0.pos_] != 'E') {
                          if (local_1e0.silence_depth_ < 1) {
                            if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 7)
                            goto LAB_002fac8c;
                            builtin_strncpy(local_1e0.out_,", ...)",7);
                            local_1e0.out_ = local_1e0.out_ + 6;
                          }
                          local_1e0.silence_depth_ = local_1e0.silence_depth_ + 1;
                          goto LAB_002fa4f1;
                        }
                        local_1e0.pos_ = local_1e0.pos_ + 1;
LAB_002fa325:
                        if (local_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 2)
                          goto LAB_002fac8c;
                          local_1e0.out_[0] = ')';
                          local_1e0.out_[1] = '\0';
LAB_002fa6a0:
                          local_1e0.out_ = local_1e0.out_ + 1;
                        }
                        break;
                      case kAfterSubsequentTupleElement:
LAB_002fa4f1:
                        if (local_1e0.encoding_[local_1e0.pos_] == 'E') {
                          local_1e0.pos_ = local_1e0.pos_ + 1;
                          goto switchD_002f9f77_caseD_9;
                        }
                        if (local_1e0.recursion_depth_ == 0x100) goto LAB_002fac8c;
                        uVar12 = (ulong)(uint)local_1e0.recursion_depth_;
                        local_1e0.recursion_depth_ = uVar8;
                        local_1e0.recursion_stack_[uVar12] = kAfterSubsequentTupleElement;
                        uVar8 = local_1e0.pos_;
                        goto LAB_002f9a76;
                      case kContinueParameterList:
                        goto switchD_002f9f77_caseD_13;
                      case kBeginAutoTraits:
                      case kContinueAutoTraits:
                        goto switchD_002f9f77_caseD_15;
                      case kContinueDynTrait:
                        if (local_1e0.encoding_[local_1e0.pos_] == 'p') {
                          if (local_1e0.silence_depth_ < 1) {
                            if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 3)
                            goto LAB_002fac8c;
                            local_1e0.out_[2] = '\0';
                            local_1e0.out_[0] = '<';
                            local_1e0.out_[1] = '>';
                            local_1e0.out_ = local_1e0.out_ + 2;
                          }
                          local_1e0.silence_depth_ = local_1e0.silence_depth_ + 1;
                          goto LAB_002fa3bc;
                        }
                        break;
                      case kContinueAssocBinding:
LAB_002fa3bc:
                        if (local_1e0.encoding_[local_1e0.pos_] == 'p') {
                          local_1e0.pos_ = local_1e0.pos_ + 1;
                          bVar7 = 0;
                          bVar6 = anon_unknown_0::RustSymbolParser::ParseUndisambiguatedIdentifier
                                            (&local_1e0,'\0',0);
                          if (!bVar6) goto LAB_002fac8f;
                          lVar10 = (long)local_1e0.recursion_depth_;
                          if (lVar10 == 0x100) goto LAB_002fac8c;
                          local_1e0.recursion_depth_ = local_1e0.recursion_depth_ + 1;
                          local_1e0.recursion_stack_[lVar10] = kContinueAssocBinding;
                          uVar8 = local_1e0.pos_;
                          goto LAB_002f9a76;
                        }
switchD_002f9f77_caseD_9:
                        local_1e0.silence_depth_ = local_1e0.silence_depth_ + -1;
                        break;
                      case kConstData:
                        local_1e0.silence_depth_ = local_1e0.silence_depth_ + -1;
                        if (local_1e0.encoding_[local_1e0.pos_] == 'n') {
                          local_1e0.pos_ = local_1e0.pos_ + 1;
                          bVar6 = true;
                          if (iVar4 < 2) {
                            if (1 < (long)local_1e0.out_end_ - (long)local_1e0.out_) {
                              local_1e0.out_ = local_1e0.out_ + 1;
                              *pcVar2 = '-';
                              *local_1e0.out_ = '\0';
                              goto LAB_002fa058;
                            }
                            goto LAB_002fac8c;
                          }
                        }
                        else {
LAB_002fa058:
                          bVar6 = true;
                          if (local_1e0.silence_depth_ < 1) {
                            if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 3)
                            goto LAB_002fac8c;
                            local_1e0.out_[2] = '\0';
                            local_1e0.out_[0] = '0';
                            local_1e0.out_[1] = 'x';
                            local_1e0.out_ = local_1e0.out_ + 2;
                            bVar6 = false;
                          }
                        }
                        pcVar2 = local_1e0.out_;
                        uVar12 = (ulong)local_1e0.pos_;
                        cVar14 = local_1e0.encoding_[uVar12];
                        if (cVar14 == '0') {
                          if (!bVar6) {
                            if ((long)local_1e0.out_end_ - (long)local_1e0.out_ < 2)
                            goto LAB_002fac8c;
                            local_1e0.out_ = local_1e0.out_ + 1;
                            *pcVar2 = '0';
                            *local_1e0.out_ = '\0';
                          }
                          if (local_1e0.encoding_[(int)(local_1e0.pos_ + 1)] != '_')
                          goto LAB_002fac8c;
                          local_1e0.pos_ = local_1e0.pos_ + 2;
                        }
                        else {
                          uVar3 = uVar12;
                          if ((byte)(cVar14 - 0x30U) < 10 || (byte)(cVar14 + 0x9fU) < 6) {
                            do {
                              pcVar2 = local_1e0.out_;
                              local_1e0.pos_ = (int)uVar12 + 1;
                              if (local_1e0.silence_depth_ < 1) {
                                if ((long)local_1e0.out_end_ - (long)local_1e0.out_ < 2)
                                goto LAB_002fac8c;
                                local_1e0.out_ = local_1e0.out_ + 1;
                                *pcVar2 = local_1e0.encoding_[uVar3];
                                *local_1e0.out_ = '\0';
                              }
                              uVar12 = (ulong)(uint)local_1e0.pos_;
                              cVar14 = local_1e0.encoding_[local_1e0.pos_];
                              uVar3 = (long)local_1e0.pos_;
                            } while ((byte)(cVar14 + 0x9fU) < 6 || (byte)(cVar14 - 0x30U) < 10);
                          }
                          if (cVar14 != '_') goto LAB_002fac8c;
                          local_1e0.pos_ = local_1e0.pos_ + 1;
                        }
                        break;
                      case kBeginGenericArgList:
                        if (local_1e0.silence_depth_ < 1) {
                          if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 5)
                          goto LAB_002fac8c;
                          builtin_strncpy(local_1e0.out_,"::<>",5);
                          local_1e0.out_ = local_1e0.out_ + 4;
                        }
                        local_1e0.silence_depth_ = local_1e0.silence_depth_ + 1;
                        goto switchD_002f9f77_caseD_1b;
                      case kContinueGenericArgList:
switchD_002f9f77_caseD_1b:
                        if (local_1e0.encoding_[local_1e0.pos_] == 'E') {
                          local_1e0.pos_ = local_1e0.pos_ + 1;
                          goto switchD_002f9f77_caseD_9;
                        }
                        if (local_1e0.recursion_depth_ == 0x100) goto LAB_002fac8c;
                        uVar12 = (ulong)(uint)local_1e0.recursion_depth_;
                        local_1e0.recursion_depth_ = uVar8;
                        local_1e0.recursion_stack_[uVar12] = kContinueGenericArgList;
                        if (local_1e0.encoding_[local_1e0.pos_] != 'K') {
                          uVar8 = local_1e0.pos_;
                          if (local_1e0.encoding_[local_1e0.pos_] == 'L') {
                            local_1e0.pos_ = local_1e0.pos_ + 1;
                            bVar6 = anon_unknown_0::RustSymbolParser::ParseBase62Number
                                              (&local_1e0,&local_1e4);
                            goto LAB_002fa488;
                          }
                          goto LAB_002f9a76;
                        }
                        local_1e0.pos_ = local_1e0.pos_ + 1;
LAB_002fa5d9:
                        uVar12 = (ulong)(uint)local_1e0.pos_;
                        cVar14 = local_1e0.encoding_[local_1e0.pos_];
                        while (cVar14 == 'B') {
                          local_1e0.pos_ = (int)uVar12 + 1;
                          bVar6 = anon_unknown_0::RustSymbolParser::BeginBackref(&local_1e0);
                          if (!bVar6) goto LAB_002fac8c;
                          if (local_1e0.silence_depth_ != 0) goto switchD_002f9f77_caseD_1e;
                          lVar10 = (long)local_1e0.recursion_depth_;
                          if (lVar10 == 0x100) goto LAB_002fac8c;
                          local_1e0.recursion_depth_ = local_1e0.recursion_depth_ + 1;
                          local_1e0.recursion_stack_[lVar10] = kConstantBackrefEnding;
                          uVar12 = (ulong)local_1e0.pos_;
                          cVar14 = local_1e0.encoding_[uVar12];
                        }
                        if (cVar14 == 'p') {
                          local_1e0.pos_ = (int)uVar12 + 1;
                          if (0 < local_1e0.silence_depth_) break;
                          if (1 < (ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_)) {
                            local_1e0.out_[0] = '_';
                            local_1e0.out_[1] = '\0';
                            goto LAB_002fa6a0;
                          }
                          goto LAB_002fac8c;
                        }
                        local_1e0.silence_depth_ = local_1e0.silence_depth_ + 1;
                        lVar10 = (long)local_1e0.recursion_depth_;
                        if (lVar10 == 0x100) goto LAB_002fac8c;
                        local_1e0.recursion_depth_ = local_1e0.recursion_depth_ + 1;
                        local_1e0.recursion_stack_[lVar10] = kConstData;
                        uVar8 = local_1e0.pos_;
                        goto LAB_002f9a76;
                      case kPathBackrefEnding:
                      case kTypeBackrefEnding:
                        goto switchD_002f9f77_caseD_1c;
                      case kConstantBackrefEnding:
switchD_002f9f77_caseD_1e:
                        lVar10 = (long)local_1e0.position_depth_;
                        local_1e0.position_depth_ = local_1e0.position_depth_ + -1;
                        local_1e0.pos_ = local_1e0.position_stack_[lVar10 + -1];
                      }
                      if (iVar15 == 0x1ffff) goto LAB_002fac8c;
LAB_002fa6b4:
                      uVar8 = local_1e0.recursion_depth_;
                      if (local_1e0.recursion_depth_ < 1) goto LAB_002fac8c;
                    } while( true );
                  }
                  goto LAB_002fac8f;
                }
                RVar13 = kTypeBackrefEnding;
                break;
              default:
                goto switchD_002f9ab7_caseD_43;
              case 'D':
                local_1e0.pos_ = local_1e0.pos_ + 1;
                if (local_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 5)
                  goto LAB_002fac8c;
                  builtin_strncpy(local_1e0.out_,"dyn ",5);
                  local_1e0.out_ = local_1e0.out_ + 4;
                }
                bVar6 = anon_unknown_0::RustSymbolParser::ParseOptionalBinder(&local_1e0);
                if (!bVar6) goto LAB_002fac8c;
                if (local_1e0.encoding_[local_1e0.pos_] == 'E') goto LAB_002fa8c2;
                RVar13 = kBeginAutoTraits;
LAB_002fa9e1:
                if (local_1e0.recursion_depth_ == 0x100) goto LAB_002fac8c;
                lVar10 = (long)local_1e0.recursion_depth_;
                local_1e0.recursion_depth_ = local_1e0.recursion_depth_ + 1;
                local_1e0.recursion_stack_[lVar10] = RVar13;
                lVar10 = (long)local_1e0.recursion_depth_;
                if (lVar10 == 0x100) goto LAB_002fac8c;
                local_1e0.recursion_depth_ = local_1e0.recursion_depth_ + 1;
                local_1e0.recursion_stack_[lVar10] = kContinueDynTrait;
                goto switchD_002f9ab7_caseD_43;
              case 'F':
                local_1e0.pos_ = local_1e0.pos_ + 1;
                if (local_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 6)
                  goto LAB_002fac8c;
                  builtin_strncpy(local_1e0.out_,"fn...",6);
                  local_1e0.out_ = local_1e0.out_ + 5;
                }
                local_1e0.silence_depth_ = local_1e0.silence_depth_ + 1;
                bVar6 = anon_unknown_0::RustSymbolParser::ParseOptionalBinder(&local_1e0);
                if (!bVar6) goto LAB_002fac8c;
                lVar10 = (long)local_1e0.pos_;
                cVar14 = local_1e0.encoding_[lVar10];
                if (cVar14 == 'U') {
                  local_1e0.pos_ = local_1e0.pos_ + 1;
                  cVar14 = local_1e0.encoding_[lVar10 + 1];
                }
                if (cVar14 == 'K') {
                  if (local_1e0.encoding_[(long)local_1e0.pos_ + 1] == 'C') {
                    local_1e0.pos_ = local_1e0.pos_ + 2;
                  }
                  else {
                    bVar7 = 0;
                    local_1e0.pos_ = local_1e0.pos_ + 1;
                    bVar6 = anon_unknown_0::RustSymbolParser::ParseUndisambiguatedIdentifier
                                      (&local_1e0,'\0',0);
                    if (!bVar6) goto LAB_002fac8f;
                  }
                }
switchD_002f9f77_caseD_13:
                if (local_1e0.encoding_[local_1e0.pos_] == 'E') {
                  local_1e0.pos_ = local_1e0.pos_ + 1;
                  lVar10 = (long)local_1e0.recursion_depth_;
                  if (lVar10 == 0x100) goto LAB_002fac8c;
                  local_1e0.recursion_depth_ = local_1e0.recursion_depth_ + 1;
                  local_1e0.recursion_stack_[lVar10] = kFinishFn;
                  uVar8 = local_1e0.pos_;
                }
                else {
                  lVar10 = (long)local_1e0.recursion_depth_;
                  if (lVar10 == 0x100) goto LAB_002fac8c;
                  local_1e0.recursion_depth_ = local_1e0.recursion_depth_ + 1;
                  local_1e0.recursion_stack_[lVar10] = kContinueParameterList;
                  uVar8 = local_1e0.pos_;
                }
                goto LAB_002f9a76;
              case 'O':
                uVar8 = local_1e0.pos_ + 1;
                if (local_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 6)
                  goto LAB_002fac8c;
                  builtin_strncpy(local_1e0.out_,"*mut ",6);
                  local_1e0.out_ = local_1e0.out_ + 5;
                }
                goto LAB_002f9a76;
              case 'P':
                uVar8 = local_1e0.pos_ + 1;
                if (local_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 8)
                  goto LAB_002fac8c;
                  builtin_strncpy(local_1e0.out_,"*const ",8);
                  local_1e0.out_ = local_1e0.out_ + 7;
                }
                goto LAB_002f9a76;
              case 'Q':
                uVar8 = (uint)((long)local_1e0.pos_ + 1);
                if (local_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 6)
                  goto LAB_002fac8c;
                  builtin_strncpy(local_1e0.out_,"&mut ",6);
                  local_1e0.out_ = local_1e0.out_ + 5;
                }
                cVar14 = local_1e0.encoding_[(long)local_1e0.pos_ + 1];
                goto joined_r0x002f9ba6;
              case 'R':
                uVar8 = local_1e0.pos_ + 1;
                if (local_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 2)
                  goto LAB_002fac8c;
                  local_1e0.out_[0] = '&';
                  local_1e0.out_[1] = '\0';
                  local_1e0.out_ = local_1e0.out_ + 1;
                }
                cVar14 = local_1e0.encoding_[(int)uVar8];
joined_r0x002f9ba6:
                if (cVar14 == 'L') {
                  local_1e0.pos_ = local_1e0.pos_ + 2;
                  bVar6 = anon_unknown_0::RustSymbolParser::ParseBase62Number(&local_1e0,&local_1e4)
                  ;
                  uVar8 = local_1e0.pos_;
                  if (!bVar6) goto LAB_002fac8c;
                }
                goto LAB_002f9a76;
              case 'S':
                local_1e0.pos_ = local_1e0.pos_ + 1;
                if (local_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 2)
                  goto LAB_002fac8c;
                  local_1e0.out_[0] = '[';
                  local_1e0.out_[1] = '\0';
                  local_1e0.out_ = local_1e0.out_ + 1;
                }
                RVar13 = kSliceEnding;
                break;
              case 'T':
                if (local_1e0.silence_depth_ < 1) {
                  if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 2)
                  goto LAB_002fac8c;
                  local_1e0.out_[0] = '(';
                  local_1e0.out_[1] = '\0';
                  local_1e0.out_ = local_1e0.out_ + 1;
                }
                if (local_1e0.encoding_[(int)(local_1e0.pos_ + 1U)] == 'E') {
                  local_1e0.pos_ = local_1e0.pos_ + 2;
                  if (0 < local_1e0.silence_depth_) goto LAB_002f9f37;
                  if (1 < (ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_)) {
                    local_1e0.out_[0] = ')';
                    local_1e0.out_[1] = '\0';
                    local_1e0.out_ = local_1e0.out_ + 1;
                    goto LAB_002f9f37;
                  }
                  goto LAB_002fac8c;
                }
                RVar13 = kAfterFirstTupleElement;
                local_1e0.pos_ = local_1e0.pos_ + 1U;
              }
              if (local_1e0.recursion_depth_ == 0x100) goto LAB_002fac8c;
              lVar10 = (long)local_1e0.recursion_depth_;
              local_1e0.recursion_depth_ = local_1e0.recursion_depth_ + 1;
              local_1e0.recursion_stack_[lVar10] = RVar13;
              uVar8 = local_1e0.pos_;
              goto LAB_002f9a76;
            }
            goto LAB_002fac8c;
          }
          if (local_1e0.silence_depth_ < 1) {
            if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 2) goto LAB_002fac8c;
            local_1e0.out_[0] = '<';
            local_1e0.out_[1] = '\0';
            local_1e0.out_ = local_1e0.out_ + 1;
          }
          RVar13 = kTraitImplType;
        }
        if (local_1e0.recursion_depth_ == 0x100) goto LAB_002fac8c;
        lVar10 = (long)local_1e0.recursion_depth_;
        local_1e0.recursion_depth_ = local_1e0.recursion_depth_ + 1;
        local_1e0.pos_ = uVar8;
        local_1e0.recursion_stack_[lVar10] = RVar13;
        local_1e0.silence_depth_ = local_1e0.silence_depth_ + 1;
        bVar6 = anon_unknown_0::RustSymbolParser::ParseDisambiguator(&local_1e0,&local_1e4);
        if ((!bVar6) || (lVar10 = (long)local_1e0.recursion_depth_, lVar10 == 0x100))
        goto LAB_002fac8c;
        local_1e0.recursion_depth_ = local_1e0.recursion_depth_ + 1;
        local_1e0.recursion_stack_[lVar10] = kImplPathEnding;
      }
switchD_002f9ab7_caseD_43:
      goto LAB_002f9930;
    }
  }
  else {
LAB_002fac8c:
    bVar7 = 0;
  }
LAB_002fac8f:
  return (bool)(bVar7 & 1);
switchD_002f9f77_caseD_15:
  if (local_1e0.encoding_[local_1e0.pos_] != 'E') {
    if (local_1e0.silence_depth_ < 1) {
      if ((ulong)((long)local_1e0.out_end_ - (long)local_1e0.out_) < 4) goto LAB_002fac8c;
      builtin_strncpy(local_1e0.out_," + ",4);
      local_1e0.out_ = local_1e0.out_ + 3;
    }
    RVar13 = kContinueAutoTraits;
    goto LAB_002fa9e1;
  }
LAB_002fa8c2:
  local_1e0.pos_ = local_1e0.pos_ + 1;
  bVar6 = anon_unknown_0::RustSymbolParser::ParseRequiredLifetime(&local_1e0);
  if (!bVar6) goto LAB_002fac8c;
  goto LAB_002f9f37;
}

Assistant:

bool DemangleRustSymbolEncoding(const char* mangled, char* out,
                                size_t out_size) {
  return RustSymbolParser(mangled, out, out + out_size).Parse();
}